

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O3

void av1_read_tx_type(AV1_COMMON *cm,MACROBLOCKD *xd,int blk_row,int blk_col,TX_SIZE tx_size,
                     aom_reader *r)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  int nsyms;
  uint8_t *puVar4;
  MB_MODE_INFO *pMVar5;
  short sVar6;
  int iVar7;
  PREDICTION_MODE *pPVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  aom_cdf_prob *icdf;
  
  puVar4 = xd->tx_type_map;
  pMVar5 = *xd->mi;
  iVar11 = blk_row * xd->tx_type_map_stride + blk_col;
  puVar4[iVar11] = '\0';
  if (pMVar5->skip_txfm == '\0') {
    uVar9 = *(ushort *)&pMVar5->field_0xa7 & 7;
    if ((((cm->seg).enabled == '\0') || (((cm->seg).feature_mask[uVar9] & 0x40) == 0)) &&
       (xd->qindex[uVar9] != 0)) {
      uVar10 = 1;
      if (-1 < (char)*(ushort *)&pMVar5->field_0xa7) {
        uVar10 = (ulong)('\0' < pMVar5->ref_frame[0]);
      }
      uVar12 = (ulong)tx_size;
      if ((0x61810UL >> (uVar12 & 0x3f) & 1) == 0) {
        iVar7 = (int)uVar10;
        if ((0x18608UL >> (uVar12 & 0x3f) & 1) == 0) {
          if ((cm->features).reduced_tx_set_used == false) {
            if (av1_ext_tx_set_lookup[0]
                [(ulong)((0x60604UL >> (uVar12 & 0x3f) & 1) != 0) + (ulong)(uint)(iVar7 * 2)] ==
                '\0') {
              return;
            }
            bVar13 = av1_ext_tx_set_lookup[0]
                     [(ulong)((0x60604UL >> (uVar12 & 0x3f) & 1) != 0) + (ulong)(uint)(iVar7 * 2)];
          }
          else {
            bVar13 = (iVar7 == 0) + 1;
          }
          uVar14 = (ulong)bVar13;
        }
        else {
          if (iVar7 == 0) {
            return;
          }
          bVar13 = (byte)uVar10;
          uVar14 = uVar10;
        }
        bVar1 = ""[uVar12];
        if (iVar7 == 0) {
          if ((pMVar5->filter_intra_mode_info).use_filter_intra == '\0') {
            pPVar8 = &pMVar5->mode;
          }
          else {
            pPVar8 = "" + (pMVar5->filter_intra_mode_info).filter_intra_mode;
          }
          iVar7 = aom_read_symbol_(r,xd->tile_ctx->intra_ext_tx_cdf
                                     [ext_tx_set_index[uVar10][bVar13]][bVar1][0] +
                                     (ulong)*pPVar8 + (ulong)*pPVar8 * 0x10,
                                   av1_num_ext_tx_set[uVar14]);
        }
        else {
          icdf = xd->tile_ctx->inter_ext_tx_cdf[ext_tx_set_index[uVar10][bVar13]][0] +
                 (ulong)bVar1 + (ulong)bVar1 * 0x10;
          nsyms = av1_num_ext_tx_set[uVar14];
          iVar7 = od_ec_decode_cdf_q15(&r->ec,icdf,nsyms);
          if (r->allow_update_cdf != '\0') {
            uVar2 = icdf[nsyms];
            bVar13 = ((char)(uVar2 >> 4) - ((byte)uVar14 < 2)) + 5;
            uVar10 = 1;
            if (1 < (int)(nsyms - 1U)) {
              uVar10 = (ulong)(nsyms - 1U);
            }
            uVar12 = 0;
            do {
              uVar3 = icdf[uVar12];
              if ((long)uVar12 < (long)(char)iVar7) {
                sVar6 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar13 & 0x1f));
              }
              else {
                sVar6 = -(uVar3 >> (bVar13 & 0x1f));
              }
              icdf[uVar12] = sVar6 + uVar3;
              uVar12 = uVar12 + 1;
            } while (uVar10 != uVar12);
            icdf[nsyms] = icdf[nsyms] + (ushort)(uVar2 < 0x20);
          }
        }
        puVar4[iVar11] =
             *(uint8_t *)
              ((long)av1_ext_tx_inv[0] + (long)iVar7 * 4 + (ulong)(uint)((int)uVar14 << 6));
      }
    }
  }
  return;
}

Assistant:

void av1_read_tx_type(const AV1_COMMON *const cm, MACROBLOCKD *xd, int blk_row,
                      int blk_col, TX_SIZE tx_size, aom_reader *r) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  uint8_t *tx_type =
      &xd->tx_type_map[blk_row * xd->tx_type_map_stride + blk_col];
  *tx_type = DCT_DCT;

  // No need to read transform type if block is skipped.
  if (mbmi->skip_txfm ||
      segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP))
    return;

  // No need to read transform type for lossless mode(qindex==0).
  const int qindex = xd->qindex[mbmi->segment_id];
  if (qindex == 0) return;

  const int inter_block = is_inter_block(mbmi);
  if (get_ext_tx_types(tx_size, inter_block, cm->features.reduced_tx_set_used) >
      1) {
    const TxSetType tx_set_type = av1_get_ext_tx_set_type(
        tx_size, inter_block, cm->features.reduced_tx_set_used);
    const int eset =
        get_ext_tx_set(tx_size, inter_block, cm->features.reduced_tx_set_used);
    // eset == 0 should correspond to a set with only DCT_DCT and
    // there is no need to read the tx_type
    assert(eset != 0);

    const TX_SIZE square_tx_size = txsize_sqr_map[tx_size];
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    if (inter_block) {
      *tx_type = av1_ext_tx_inv[tx_set_type][aom_read_symbol(
          r, ec_ctx->inter_ext_tx_cdf[eset][square_tx_size],
          av1_num_ext_tx_set[tx_set_type], ACCT_STR)];
    } else {
      const PREDICTION_MODE intra_mode =
          mbmi->filter_intra_mode_info.use_filter_intra
              ? fimode_to_intradir[mbmi->filter_intra_mode_info
                                       .filter_intra_mode]
              : mbmi->mode;
      *tx_type = av1_ext_tx_inv[tx_set_type][aom_read_symbol(
          r, ec_ctx->intra_ext_tx_cdf[eset][square_tx_size][intra_mode],
          av1_num_ext_tx_set[tx_set_type], ACCT_STR)];
    }
  }
}